

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_static_counter<double>::serialize(basic_static_counter<double> *this,string *str)

{
  string *in_RDI;
  double dVar1;
  metric_t *unaff_retaddr;
  double value;
  string *in_stack_00000028;
  basic_static_counter<double> *in_stack_00000030;
  string *str_00;
  
  str_00 = in_RDI;
  dVar1 = thread_local_value<double>::value((thread_local_value<double> *)unaff_retaddr);
  if (((dVar1 != 0.0) || (NAN(dVar1))) || ((in_RDI[5].field_2._M_local_buf[8] & 1U) != 0)) {
    metric_t::serialize_head(unaff_retaddr,str_00);
    serialize_default_label(in_stack_00000030,in_stack_00000028,(double)this);
  }
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto value = default_label_value_.value();
    if (value == 0 && !has_change_) {
      return;
    }

    metric_t::serialize_head(str);
    serialize_default_label(str, value);
  }